

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  pointer *pppcVar1;
  iterator __position;
  bool bVar2;
  cmMakefile *pcVar3;
  char *val;
  cmInstallSubdirectoryGenerator *this_00;
  undefined3 in_register_00000081;
  cmMakefile *subMf;
  cmStateSnapshot newSnapshot;
  cmMakefile *local_a0;
  undefined4 local_94;
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  string local_68;
  cmStateSnapshot local_48;
  
  bVar2 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar2) {
    local_94 = CONCAT31(in_register_00000081,immediate);
    cmState::CreateBuildsystemDirectorySnapshot
              (&local_48,
               (this->GlobalGenerator->CMakeInstance->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&this->StateSnapshot);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_90,&local_48);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_90,srcPath);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_90,&local_48);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_90,binPath);
    cmsys::SystemTools::MakeDirectory(binPath,(mode_t *)0x0);
    pcVar3 = (cmMakefile *)operator_new(0x7e8);
    cmMakefile(pcVar3,this->GlobalGenerator,&local_48);
    local_a0 = pcVar3;
    cmGlobalGenerator::AddMakefile(this->GlobalGenerator,pcVar3);
    bVar2 = true;
    if (!excludeFromAll) {
      local_90._0_8_ = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"EXCLUDE_FROM_ALL","");
      val = GetProperty(this,(string *)local_90);
      bVar2 = cmSystemTools::IsOn(val);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
      }
    }
    pcVar3 = local_a0;
    if (bVar2 != false) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_80 + 0x18),"EXCLUDE_FROM_ALL","");
      SetProperty(pcVar3,(string *)(local_80 + 0x18),"TRUE");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char)local_94 == '\0') {
      __position._M_current =
           (this->UnConfiguredDirectories).
           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->UnConfiguredDirectories).
          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                  ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->UnConfiguredDirectories
                   ,__position,&local_a0);
      }
      else {
        *__position._M_current = local_a0;
        pppcVar1 = &(this->UnConfiguredDirectories).
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    else {
      ConfigureSubDirectory(this,local_a0);
    }
    this_00 = (cmInstallSubdirectoryGenerator *)operator_new(0xe8);
    cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator
              (this_00,local_a0,(binPath->_M_dataplus)._M_p,excludeFromAll);
    AddInstallGenerator(this,(cmInstallGenerator *)this_00);
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll, bool immediate)
{
  // Make sure the binary directory is unique.
  if (!this->EnforceUniqueDir(srcPath, binPath)) {
    return;
  }

  cmStateSnapshot newSnapshot =
    this->GetState()->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath);

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }

  if (immediate) {
    this->ConfigureSubDirectory(subMf);
  } else {
    this->UnConfiguredDirectories.push_back(subMf);
  }

  this->AddInstallGenerator(new cmInstallSubdirectoryGenerator(
    subMf, binPath.c_str(), excludeFromAll));
}